

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

void __thiscall ScapeGoatTree::rebuild(ScapeGoatTree *this,Node *node)

{
  undefined1 auVar1 [16];
  int ns_00;
  ulong uVar2;
  Node **a_00;
  Node *pNVar3;
  Node *pNVar4;
  Node **a;
  Node *p;
  int ns;
  Node *node_local;
  ScapeGoatTree *this_local;
  
  ns_00 = size(this,node);
  pNVar3 = node->parent;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)ns_00;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  a_00 = (Node **)operator_new__(uVar2);
  packIntoArray(this,node,a_00,0);
  if (pNVar3 == (Node *)0x0) {
    pNVar3 = buildBalanced(this,a_00,0,ns_00);
    this->root = pNVar3;
    this->root->parent = (Node *)0x0;
  }
  else if (pNVar3->rightChild == node) {
    pNVar4 = buildBalanced(this,a_00,0,ns_00);
    pNVar3->rightChild = pNVar4;
    pNVar3->rightChild->parent = pNVar3;
  }
  else {
    pNVar4 = buildBalanced(this,a_00,0,ns_00);
    pNVar3->leftChild = pNVar4;
    pNVar3->leftChild->parent = pNVar3;
  }
  return;
}

Assistant:

void ScapeGoatTree::rebuild(Node *node) {
    int ns = size(node);
    Node *p = node->parent;
    auto **a = new Node *[ns];
    packIntoArray(node, a, 0);
    if (p == nullptr) {
        root = buildBalanced(a, 0, ns);
        root->parent = nullptr;
    } else if (p->rightChild == node) {
        p->rightChild = buildBalanced(a, 0, ns);
        p->rightChild->parent = p;
    } else {
        p->leftChild = buildBalanced(a, 0, ns);
        p->leftChild->parent = p;
    }
}